

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_lock.cpp
# Opt level: O0

void __kmp_acquire_queuing_lock_timed_template<false>(kmp_queuing_lock_t *lck,kmp_int32 gtid)

{
  int iVar1;
  kmp_uint32 kVar2;
  ulong uVar3;
  kmp_info_t *pkVar4;
  kmp_uint32 *pkVar5;
  ulong *puVar6;
  int in_ESI;
  long in_RDI;
  kmp_info_t *tail_thr;
  kmp_int32 grabbed_lock;
  kmp_int32 tail;
  kmp_int32 head;
  kmp_int32 enqueued;
  kmp_int32 need_mf;
  kmp_uint32 *spin_here_p;
  kmp_int32 *tail_id_p;
  kmp_int32 *head_id_p;
  kmp_info_t *this_thr;
  kmp_info_t *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  int local_40;
  kmp_uint32 checker;
  uint uVar7;
  undefined4 uVar8;
  
  pkVar4 = __kmp_threads[in_ESI];
  pkVar5 = (kmp_uint32 *)(in_RDI + 0x14);
  puVar6 = (ulong *)(in_RDI + 0x10);
  uVar8 = 1;
  if (__kmp_itt_fsync_prepare_ptr__3_0 != (undefined1 *)0x0) {
    (*(code *)__kmp_itt_fsync_prepare_ptr__3_0)(in_RDI);
  }
  (pkVar4->th).th_spin_here = 1;
  do {
    checker = *pkVar5;
    if (checker == 0xffffffff) {
      local_40 = 0;
      uVar8 = 0;
      LOCK();
      uVar3 = *puVar6;
      if (uVar3 == 0xffffffff00000000) {
        *puVar6 = (long)in_ESI + 1U << 0x20 | (long)in_ESI + 1U;
      }
      UNLOCK();
      uVar7 = (uint)(uVar3 == 0xffffffff00000000);
    }
    else if (checker == 0) {
      LOCK();
      kVar2 = *pkVar5;
      if (kVar2 == 0) {
        *pkVar5 = 0xffffffff;
      }
      UNLOCK();
      if (kVar2 == 0) {
        (pkVar4->th).th_spin_here = 0;
        if (__kmp_itt_fsync_acquired_ptr__3_0 == (undefined1 *)0x0) {
          return;
        }
        (*(code *)__kmp_itt_fsync_acquired_ptr__3_0)(in_RDI);
        return;
      }
      uVar7 = 0;
      in_stack_ffffffffffffffbc = 0;
    }
    else {
      local_40 = *(int *)puVar6;
      if (local_40 == 0) {
        uVar7 = 0;
      }
      else {
        uVar8 = 0;
        LOCK();
        iVar1 = *(int *)puVar6;
        if (local_40 == iVar1) {
          *(int *)puVar6 = in_ESI + 1;
        }
        UNLOCK();
        uVar7 = (uint)(local_40 == iVar1);
      }
    }
    if (uVar7 != 0) {
      if (0 < local_40) {
        in_stack_ffffffffffffffb0 = __kmp_threads[local_40 + -1];
        if (in_stack_ffffffffffffffb0 == (kmp_info_t *)0x0) {
          __kmp_debug_assert((char *)tail_id_p,(char *)spin_here_p,need_mf);
        }
        (in_stack_ffffffffffffffb0->th).th_next_waiting = in_ESI + 1;
      }
      __kmp_wait_yield_4((kmp_uint32 *)CONCAT44(uVar8,uVar7),checker,
                         (_func_kmp_uint32_kmp_uint32_kmp_uint32 *)
                         CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                         in_stack_ffffffffffffffb0);
      return;
    }
    __kmp_x86_pause();
    __kmp_yield(0);
  } while( true );
}

Assistant:

__forceinline static void
__kmp_acquire_queuing_lock_timed_template( kmp_queuing_lock_t *lck,
  kmp_int32 gtid )
{
    register kmp_info_t *this_thr    = __kmp_thread_from_gtid( gtid );
    volatile kmp_int32  *head_id_p   = & lck->lk.head_id;
    volatile kmp_int32  *tail_id_p   = & lck->lk.tail_id;
    volatile kmp_uint32 *spin_here_p;
    kmp_int32 need_mf = 1;

#if OMPT_SUPPORT
    ompt_state_t prev_state = ompt_state_undefined;
#endif

    KA_TRACE( 1000, ("__kmp_acquire_queuing_lock: lck:%p, T#%d entering\n", lck, gtid ));

    KMP_FSYNC_PREPARE( lck );
    KMP_DEBUG_ASSERT( this_thr != NULL );
    spin_here_p = & this_thr->th.th_spin_here;

#ifdef DEBUG_QUEUING_LOCKS
    TRACE_LOCK( gtid+1, "acq ent" );
    if ( *spin_here_p )
        __kmp_dump_queuing_lock( this_thr, gtid, lck, *head_id_p, *tail_id_p );
    if ( this_thr->th.th_next_waiting != 0 )
        __kmp_dump_queuing_lock( this_thr, gtid, lck, *head_id_p, *tail_id_p );
#endif
    KMP_DEBUG_ASSERT( !*spin_here_p );
    KMP_DEBUG_ASSERT( this_thr->th.th_next_waiting == 0 );


    /* The following st.rel to spin_here_p needs to precede the cmpxchg.acq to head_id_p
       that may follow, not just in execution order, but also in visibility order.  This way,
       when a releasing thread observes the changes to the queue by this thread, it can
       rightly assume that spin_here_p has already been set to TRUE, so that when it sets
       spin_here_p to FALSE, it is not premature.  If the releasing thread sets spin_here_p
       to FALSE before this thread sets it to TRUE, this thread will hang.
    */
    *spin_here_p = TRUE;  /* before enqueuing to prevent race */

    while( 1 ) {
        kmp_int32 enqueued;
        kmp_int32 head;
        kmp_int32 tail;

        head = *head_id_p;

        switch ( head ) {

            case -1:
            {
#ifdef DEBUG_QUEUING_LOCKS
                tail = *tail_id_p;
                TRACE_LOCK_HT( gtid+1, "acq read: ", head, tail );
#endif
                tail = 0;  /* to make sure next link asynchronously read is not set accidentally;
                           this assignment prevents us from entering the if ( t > 0 )
                           condition in the enqueued case below, which is not necessary for
                           this state transition */

                need_mf = 0;
                /* try (-1,0)->(tid,tid) */
                enqueued = KMP_COMPARE_AND_STORE_ACQ64( (volatile kmp_int64 *) tail_id_p,
                  KMP_PACK_64( -1, 0 ),
                  KMP_PACK_64( gtid+1, gtid+1 ) );
#ifdef DEBUG_QUEUING_LOCKS
                  if ( enqueued ) TRACE_LOCK( gtid+1, "acq enq: (-1,0)->(tid,tid)" );
#endif
            }
            break;

            default:
            {
                tail = *tail_id_p;
                KMP_DEBUG_ASSERT( tail != gtid + 1 );

#ifdef DEBUG_QUEUING_LOCKS
                TRACE_LOCK_HT( gtid+1, "acq read: ", head, tail );
#endif

                if ( tail == 0 ) {
                    enqueued = FALSE;
                }
                else {
                    need_mf = 0;
                    /* try (h,t) or (h,h)->(h,tid) */
                    enqueued = KMP_COMPARE_AND_STORE_ACQ32( tail_id_p, tail, gtid+1 );

#ifdef DEBUG_QUEUING_LOCKS
                        if ( enqueued ) TRACE_LOCK( gtid+1, "acq enq: (h,t)->(h,tid)" );
#endif
                }
            }
            break;

            case 0: /* empty queue */
            {
                kmp_int32 grabbed_lock;

#ifdef DEBUG_QUEUING_LOCKS
                tail = *tail_id_p;
                TRACE_LOCK_HT( gtid+1, "acq read: ", head, tail );
#endif
                /* try (0,0)->(-1,0) */

                /* only legal transition out of head = 0 is head = -1 with no change to tail */
                grabbed_lock = KMP_COMPARE_AND_STORE_ACQ32( head_id_p, 0, -1 );

                if ( grabbed_lock ) {

                    *spin_here_p = FALSE;

                    KA_TRACE( 1000, ("__kmp_acquire_queuing_lock: lck:%p, T#%d exiting: no queuing\n",
                              lck, gtid ));
#ifdef DEBUG_QUEUING_LOCKS
                    TRACE_LOCK_HT( gtid+1, "acq exit: ", head, 0 );
#endif

#if OMPT_SUPPORT
                    if (ompt_enabled && prev_state != ompt_state_undefined) {
                        /* change the state before clearing wait_id */
                        this_thr->th.ompt_thread_info.state = prev_state;
                        this_thr->th.ompt_thread_info.wait_id = 0;
                    }
#endif

                    KMP_FSYNC_ACQUIRED( lck );
                    return; /* lock holder cannot be on queue */
                }
                enqueued = FALSE;
            }
            break;
        }

#if OMPT_SUPPORT
        if (ompt_enabled && prev_state == ompt_state_undefined) {
            /* this thread will spin; set wait_id before entering wait state */
            prev_state = this_thr->th.ompt_thread_info.state;
            this_thr->th.ompt_thread_info.wait_id = (uint64_t) lck;
            this_thr->th.ompt_thread_info.state = ompt_state_wait_lock;
        }
#endif

        if ( enqueued ) {
            if ( tail > 0 ) {
                kmp_info_t *tail_thr = __kmp_thread_from_gtid( tail - 1 );
                KMP_ASSERT( tail_thr != NULL );
                tail_thr->th.th_next_waiting = gtid+1;
                /* corresponding wait for this write in release code */
            }
            KA_TRACE( 1000, ("__kmp_acquire_queuing_lock: lck:%p, T#%d waiting for lock\n", lck, gtid ));


            /* ToDo: May want to consider using __kmp_wait_sleep  or something that sleeps for
             *       throughput only here.
             */
            KMP_MB();
            KMP_WAIT_YIELD(spin_here_p, FALSE, KMP_EQ, lck);

#ifdef DEBUG_QUEUING_LOCKS
            TRACE_LOCK( gtid+1, "acq spin" );

            if ( this_thr->th.th_next_waiting != 0 )
                __kmp_dump_queuing_lock( this_thr, gtid, lck, *head_id_p, *tail_id_p );
#endif
            KMP_DEBUG_ASSERT( this_thr->th.th_next_waiting == 0 );
            KA_TRACE( 1000, ("__kmp_acquire_queuing_lock: lck:%p, T#%d exiting: after waiting on queue\n",
                      lck, gtid ));

#ifdef DEBUG_QUEUING_LOCKS
            TRACE_LOCK( gtid+1, "acq exit 2" );
#endif

#if OMPT_SUPPORT
            /* change the state before clearing wait_id */
            this_thr->th.ompt_thread_info.state = prev_state;
            this_thr->th.ompt_thread_info.wait_id = 0;
#endif

            /* got lock, we were dequeued by the thread that released lock */
            return;
        }

        /* Yield if number of threads > number of logical processors */
        /* ToDo: Not sure why this should only be in oversubscription case,
           maybe should be traditional YIELD_INIT/YIELD_WHEN loop */
        KMP_YIELD( TCR_4( __kmp_nth ) > (__kmp_avail_proc ? __kmp_avail_proc :
          __kmp_xproc ) );
#ifdef DEBUG_QUEUING_LOCKS
        TRACE_LOCK( gtid+1, "acq retry" );
#endif

    }
    KMP_ASSERT2( 0, "should not get here" );
}